

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidConvolutionNoPadding(void)

{
  RepeatedField<long> *this;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  ConvolutionLayerParams *pCVar14;
  ostream *poVar15;
  undefined8 *puVar16;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar17;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar18;
  Arena *pAVar19;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018ffcc:
    pRVar17 = &(MStack_78.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0018ffcc;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar16);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  this = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar2] = 3;
  uVar18 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar18;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar18 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar18] = 100;
  uVar18 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar18;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar18 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar18] = 100;
  this->current_size_ = uVar2 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00190138:
    pRVar17 = &(MStack_78.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_00190138;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"probs",puVar16);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar19 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar19);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00190228:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar11);
  }
  else {
    iVar1 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_00190228;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00190260:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar1 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_00190260;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3cb973);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar13 = pRVar4->elements[iVar1];
      goto LAB_001902ca;
    }
  }
  pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
LAB_001902ca:
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3b872d);
  if (pNVar11->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 100;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pCVar14 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::ConvolutionLayerParams>(pAVar19);
    (pNVar11->layer_).convolution_ = pCVar14;
  }
  pCVar14 = (pNVar11->layer_).convolution_;
  pCVar14->outputchannels_ = 5;
  pCVar14->kernelchannels_ = 3;
  pCVar14->hasbias_ = false;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar6 = CoreML::Result::good(&local_48);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x576);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar6;
}

Assistant:

int testInvalidConvolutionNoPadding() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);

    params->set_hasbias(false);

    // not specifying a padding type should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}